

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_authentication(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  saslprogress local_34;
  anon_union_280_8_fcbf97e8_for_proto *paStack_30;
  saslprogress progress;
  imap_conn *imapc;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  imapc._4_4_ = CURLE_OK;
  paStack_30 = &conn->proto;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  if (((*(byte *)((long)&conn->proto + 0xfb) >> 1 & 1) == 0) &&
     (_Var1 = Curl_sasl_can_authenticate(&(conn->proto).imapc.sasl,data), _Var1)) {
    imapc._4_4_ = Curl_sasl_start(&(paStack_30->imapc).sasl,(Curl_easy *)conn_local,
                                  (*(byte *)((long)paStack_30 + 0xfb) >> 4 & 1) != 0,&local_34);
    if (imapc._4_4_ == CURLE_OK) {
      if (local_34 == SASL_INPROGRESS) {
        imap_state((Curl_easy *)conn_local,IMAP_AUTHENTICATE);
      }
      else if (((*(byte *)((long)paStack_30 + 0xfb) >> 3 & 1) == 0) &&
              (((paStack_30->imapc).preftype & 1) != 0)) {
        imapc._4_4_ = imap_perform_login((Curl_easy *)conn_local,pcStack_20);
      }
      else {
        if (((conn_local != (connectdata *)0x0) &&
            ((*(ulong *)&conn_local[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
           ((*(long *)(conn_local[3].secondary.remote_ip + 0xc) == 0 ||
            (0 < *(int *)(*(long *)(conn_local[3].secondary.remote_ip + 0xc) + 8))))) {
          Curl_infof((Curl_easy *)conn_local,"No known authentication mechanisms supported");
        }
        imapc._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    data_local._4_4_ = imapc._4_4_;
  }
  else {
    imap_state((Curl_easy *)conn_local,IMAP_STOP);
    data_local._4_4_ = imapc._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_perform_authentication(struct Curl_easy *data,
                                            struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  /* Check if already authenticated OR if there is enough data to authenticate
     with and end the connect phase if we do not */
  if(imapc->preauth ||
     !Curl_sasl_can_authenticate(&imapc->sasl, data)) {
    imap_state(data, IMAP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&imapc->sasl, data, imapc->ir_supported, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      imap_state(data, IMAP_AUTHENTICATE);
    else if(!imapc->login_disabled && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(data, conn);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}